

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O3

void __thiscall
soplex::SPxSolverBase<double>::qualRedCostViolation
          (SPxSolverBase<double> *this,double *maxviol,double *sumviol)

{
  double dVar1;
  uint uVar2;
  pointer pdVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  *maxviol = 0.0;
  *sumviol = 0.0;
  uVar2 = (this->thecovectors->set).thenum;
  if (this->theType == ENTER) {
    if (0 < (int)uVar2) {
      pdVar3 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = 0;
      do {
        dVar1 = pdVar3[uVar5];
        if ((dVar1 < 0.0) && (*sumviol = *sumviol - dVar1, dVar1 < *maxviol)) {
          *maxviol = dVar1;
        }
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
    }
    lVar4 = (long)(this->thevectors->set).thenum;
    if (0 < lVar4) {
      pdVar3 = (this->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = 0;
      do {
        dVar1 = pdVar3[lVar6];
        if ((dVar1 < 0.0) && (*sumviol = *sumviol - dVar1, dVar1 < *maxviol)) {
          *maxviol = dVar1;
        }
        lVar6 = lVar6 + 1;
      } while (lVar4 != lVar6);
    }
  }
  else if (0 < (int)uVar2) {
    pdVar3 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      dVar1 = pdVar3[uVar5];
      if ((dVar1 < 0.0) && (*sumviol = *sumviol - dVar1, dVar1 < *maxviol)) {
        *maxviol = dVar1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  *maxviol = -*maxviol;
  return;
}

Assistant:

void SPxSolverBase<R>::qualRedCostViolation(R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   int i;

   // TODO:   y = c_B * B^-1  => coSolve(y, c_B)
   //         redcost = c_N - yA_N
   // solve system "x = e_i^T * B^-1" to get i'th row of B^-1
   // VectorBase<R> y( this->nRows() );
   // basis().coSolve( x, spx->unitVector( i ) );
   // VectorBase<R> rdcost( this->nCols() );
   if(type() == ENTER)
   {
      for(i = 0; i < dim(); ++i)
      {
         R x = coTest()[i];

         if(x < 0.0)
         {
            sumviol -= x;

            if(x < maxviol)
               maxviol = x;
         }
      }

      for(i = 0; i < coDim(); ++i)
      {
         R x = test()[i];

         if(x < 0.0)
         {
            sumviol -= x;

            if(x < maxviol)
               maxviol = x;
         }
      }
   }
   else
   {
      assert(type() == LEAVE);

      for(i = 0; i < dim(); ++i)
      {
         R x = fTest()[i];

         if(x < 0.0)
         {
            sumviol -= x;

            if(x < maxviol)
               maxviol = x;
         }
      }
   }

   maxviol *= -1;
}